

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase376::run(TestCase376 *this)

{
  char **ppcVar1;
  ArrayDisposer **ppAVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  bool local_1e1;
  undefined1 local_1e0 [7];
  bool _kj_shouldLog_5;
  bool local_1c1;
  String *pSStack_1c0;
  bool _kj_shouldLog_4;
  String *value_2;
  Maybe<kj::String> result_2;
  Input input_2;
  StringPtr text_2;
  undefined1 local_160 [7];
  bool _kj_shouldLog_3;
  bool local_141;
  String *pSStack_140;
  bool _kj_shouldLog_2;
  String *value_1;
  Maybe<kj::String> result_1;
  Input input_1;
  StringPtr text_1;
  undefined1 local_e0 [7];
  bool _kj_shouldLog_1;
  bool local_c1;
  String *pSStack_c0;
  bool _kj_shouldLog;
  String *value;
  undefined1 local_a8 [8];
  Maybe<kj::String> result;
  Input input;
  StringPtr text;
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>,_kj::parse::_::ArrayToString>
  parser;
  TestCase376 *this_local;
  
  text.content.size_ = 0;
  ppcVar1 = &input.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"\'hello\'");
  pcVar4 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar5 = StringPtr::end((StringPtr *)ppcVar1);
  ppAVar2 = &result.ptr.field_1.value.content.disposer;
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)ppAVar2,pcVar4,pcVar5);
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::String> *)local_a8,
             (Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>,_kj::parse::_::ArrayToString>
              *)&text.content.size_,(IteratorInput<char,_const_char_*> *)ppAVar2);
  pSStack_c0 = kj::_::readMaybe<kj::String>((Maybe<kj::String> *)local_a8);
  if (pSStack_c0 == (String *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x182);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_e0,(char (*) [28])"Expected \"hello\", got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_e0);
  }
  else {
    bVar3 = kj::operator==("hello",pSStack_c0);
    if (!bVar3) {
      local_c1 = kj::_::Debug::shouldLog(ERROR);
      while (local_c1 != false) {
        kj::_::Debug::log<char_const(&)[39],char_const(&)[6],kj::String&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                   ,0x180,ERROR,
                   "\"failed: expected \" \"(\\\"hello\\\") == (*value)\", \"hello\", *value",
                   (char (*) [39])"failed: expected (\"hello\") == (*value)",(char (*) [6])0x640f73,
                   pSStack_c0);
        local_c1 = false;
      }
    }
  }
  bVar3 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)&result.ptr.field_1.value.content.disposer
                    );
  if (!bVar3) {
    text_1.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (text_1.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x184,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      text_1.content.size_._7_1_ = false;
    }
  }
  Maybe<kj::String>::~Maybe((Maybe<kj::String> *)local_a8);
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)&result.ptr.field_1.value.content.disposer);
  ppcVar1 = &input_1.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"\'test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\x01\x02\x1cn\'")
  ;
  pcVar4 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar5 = StringPtr::end((StringPtr *)ppcVar1);
  ppAVar2 = &result_1.ptr.field_1.value.content.disposer;
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)ppAVar2,pcVar4,pcVar5);
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::String> *)&value_1,
             (Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>,_kj::parse::_::ArrayToString>
              *)&text.content.size_,(IteratorInput<char,_const_char_*> *)ppAVar2);
  pSStack_140 = kj::_::readMaybe<kj::String>((Maybe<kj::String> *)&value_1);
  if (pSStack_140 == (String *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x18e);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_160,(char (*) [27])"Expected string, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_160);
  }
  else {
    bVar3 = kj::operator==("test\a\b\f\n\r\t\v\'\"?\x01\x02\x1cn",pSStack_140);
    if (!bVar3) {
      local_141 = kj::_::Debug::shouldLog(ERROR);
      while (local_141 != false) {
        kj::_::Debug::log<char_const(&)[71],char_const(&)[19],kj::String&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                   ,0x18c,ERROR,
                   "\"failed: expected \" \"(\\\"test\\\\a\\\\b\\\\f\\\\n\\\\r\\\\t\\\\v\\\\\'\\\\\\\"\\\\?\\\\x01\\\\2\\\\34\\\\156\\\") == (*value)\", \"test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\\x01\\2\\34\\156\", *value"
                   ,(char (*) [71])
                    "failed: expected (\"test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\\x01\\2\\34\\156\") == (*value)"
                   ,(char (*) [19])"test\a\b\f\n\r\t\v\'\"?\x01\x02\x1cn",pSStack_140);
        local_141 = false;
      }
    }
  }
  bVar3 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)
                     &result_1.ptr.field_1.value.content.disposer);
  if (!bVar3) {
    text_2.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (text_2.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,400,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      text_2.content.size_._7_1_ = false;
    }
  }
  Maybe<kj::String>::~Maybe((Maybe<kj::String> *)&value_1);
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)&result_1.ptr.field_1.value.content.disposer);
  ppcVar1 = &input_2.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"\'foo\"bar\'");
  pcVar4 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar5 = StringPtr::end((StringPtr *)ppcVar1);
  ppAVar2 = &result_2.ptr.field_1.value.content.disposer;
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)ppAVar2,pcVar4,pcVar5);
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::String> *)&value_2,
             (Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>,_kj::parse::_::ArrayToString>
              *)&text.content.size_,(IteratorInput<char,_const_char_*> *)ppAVar2);
  pSStack_1c0 = kj::_::readMaybe<kj::String>((Maybe<kj::String> *)&value_2);
  if (pSStack_1c0 == (String *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x19a);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_1e0,(char (*) [27])"Expected string, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_1e0);
  }
  else {
    bVar3 = kj::operator==("foo\"bar",pSStack_1c0);
    if (!bVar3) {
      local_1c1 = kj::_::Debug::shouldLog(ERROR);
      while (local_1c1 != false) {
        kj::_::Debug::log<char_const(&)[42],char_const(&)[8],kj::String&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                   ,0x198,ERROR,
                   "\"failed: expected \" \"(\\\"foo\\\\\\\"bar\\\") == (*value)\", \"foo\\\"bar\", *value"
                   ,(char (*) [42])"failed: expected (\"foo\\\"bar\") == (*value)",
                   (char (*) [8])"foo\"bar",pSStack_1c0);
        local_1c1 = false;
      }
    }
  }
  bVar3 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)
                     &result_2.ptr.field_1.value.content.disposer);
  if (!bVar3) {
    local_1e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e1 != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x19c,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      local_1e1 = false;
    }
  }
  Maybe<kj::String>::~Maybe((Maybe<kj::String> *)&value_2);
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)&result_2.ptr.field_1.value.content.disposer);
  return;
}

Assistant:

TEST(CharParsers, SingleQuotedString) {
  constexpr auto parser = singleQuotedString;

  {
    StringPtr text = "\'hello\'";
    Input input(text.begin(), text.end());
    Maybe<String> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ("hello", *value);
    } else {
      ADD_FAILURE() << "Expected \"hello\", got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }